

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_encode_ext_safe(char *data,ptrdiff_t *data_sz,int8_t type,char *str,uint32_t len)

{
  long lVar1;
  int iVar2;
  
  if (data_sz != (ptrdiff_t *)0x0) {
    if (((0xf < len - 1) || (iVar2 = 2, mp_ext_hint[len - 1] == '\0')) && (iVar2 = 3, 0xff < len)) {
      iVar2 = (uint)(0xffff < len) * 2 + 4;
    }
    *data_sz = *data_sz - (ulong)(iVar2 + len);
    if (*data_sz < 0) {
      return data;
    }
  }
  if ((len - 1 < 0x10) && (mp_ext_hint[len - 1] != '\0')) {
    *data = mp_ext_hint[len - 1];
    lVar1 = 1;
  }
  else if (len < 0x100) {
    *data = -0x39;
    data[1] = (char)len;
    lVar1 = 2;
  }
  else if (len < 0x10000) {
    *data = -0x38;
    *(ushort *)(data + 1) = (ushort)len << 8 | (ushort)len >> 8;
    lVar1 = 3;
  }
  else {
    *data = -0x37;
    *(uint32_t *)(data + 1) =
         len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    lVar1 = 5;
  }
  (data + lVar1 + 1)[-1] = type;
  memcpy(data + lVar1 + 1,str,(ulong)len);
  return data + (ulong)len + lVar1 + 1;
}

Assistant:

MP_IMPL char *
mp_encode_ext_safe(char *data, ptrdiff_t *data_sz,
		   int8_t type, const char *str, uint32_t len)
{
	if (data_sz != NULL) {
		*data_sz -= mp_sizeof_ext(len);
		if (*data_sz < 0)
			return data;
	}
	return mp_encode_ext(data, type, str, len);
}